

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O3

void __thiscall QMessageBox::setDefaultButton(QMessageBox *this,QPushButton *button)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QList<QAbstractButton_*> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  QDialogButtonBox::buttons(&local_40,*(QDialogButtonBox **)(lVar3 + 0x2f8));
  if (local_40.d.size == 0) {
LAB_00502948:
    bVar5 = false;
  }
  else {
    lVar4 = 0;
    do {
      if (local_40.d.size << 3 == lVar4) goto LAB_00502948;
      lVar1 = lVar4 + 8;
      plVar2 = (long *)((long)local_40.d.ptr + lVar4);
      lVar4 = lVar1;
    } while ((QPushButton *)*plVar2 != button);
    bVar5 = lVar1 != 0;
  }
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (bVar5) {
    *(QPushButton **)(lVar3 + 800) = button;
    QPushButton::setDefault(button,true);
    QWidget::setFocus((QWidget *)button,OtherFocusReason);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBox::setDefaultButton(QPushButton *button)
{
    Q_D(QMessageBox);
    if (!d->buttonBox->buttons().contains(button))
        return;
    d->defaultButton = button;
    button->setDefault(true);
    button->setFocus();
}